

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_shared_memory_size_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  ostream *poVar1;
  ProgramSources *sources;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  string sStack_538;
  string local_518;
  string local_4f8;
  undefined1 local_4d8 [40];
  ProgramSources local_4b0;
  ShaderProgram local_3e0;
  ostringstream local_310 [376];
  ostringstream local_198 [376];
  
  getResourceLimit(ctx,0x8262);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  poVar1 = std::operator<<((ostream *)local_198,"shared uint values[");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(binding = 0) buffer Output {\n");
  poVar1 = std::operator<<(poVar1,"    uint values;\n");
  std::operator<<(poVar1,"} sb_out;\n");
  poVar1 = std::operator<<((ostream *)local_310,"    sb_out.values = values[");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"];\n");
  renderCtx = ctx->m_renderCtx;
  memset(&local_4b0,0,0xac);
  local_4b0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4b0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_4b0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_4b0._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_4f8,ctx,&local_518,&sStack_538);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4d8,&local_4f8);
  sources = glu::ProgramSources::operator<<(&local_4b0,(ShaderSource *)local_4d8);
  glu::ShaderProgram::ShaderProgram(&local_3e0,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_4d8 + 8));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&sStack_538);
  std::__cxx11::string::~string((string *)&local_518);
  glu::ProgramSources::~ProgramSources(&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHARED_MEMORY_SIZE.",
             (allocator<char> *)local_4d8);
  NegativeTestContext::beginSection(ctx,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  verifyLinkError(ctx,&local_3e0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_3e0);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void exceed_shared_memory_size_limit (NegativeTestContext& ctx)
{
	const int			limit				= getResourceLimit(ctx, GL_MAX_COMPUTE_SHARED_MEMORY_SIZE);
	const long			numberOfElements	= limit / sizeof(GLuint);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "shared uint values[" << numberOfElements + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint values;\n"
				<< "} sb_out;\n";

	shaderBody	<< "    sb_out.values = values[" << numberOfElements << "];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHARED_MEMORY_SIZE.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}